

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::DoProperties(CEditor *this,CUIRect *pToolBox,CProperty *pProps,int *pIDs,int *pNewVal)

{
  vec3 hsv;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CUI *pCVar5;
  CEditorImage **ppCVar6;
  undefined8 in_RCX;
  vec4 *in_RDX;
  CUIRect *in_RSI;
  CEditor *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  float fVar7;
  vec3 vVar8;
  int r;
  int v;
  int c;
  int NewColor;
  int NewValue;
  int i;
  int Change;
  CUIRect Down;
  CUIRect Up;
  CUIRect Right;
  CUIRect Left;
  vec3 c_1;
  vec4 Color;
  CUIRect ColorSlots;
  CUIRect ColorBox;
  CUIRect Yes;
  CUIRect No;
  CUIRect Dec;
  CUIRect Inc;
  CUIRect Shifter;
  CUIRect Label;
  CUIRect Slot;
  char aBuf_1 [64];
  char aBuf [64];
  char *in_stack_fffffffffffffd68;
  code *pcVar9;
  undefined4 in_stack_fffffffffffffd70;
  float in_stack_fffffffffffffd74;
  char *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd80;
  float in_stack_fffffffffffffd84;
  float in_stack_fffffffffffffd88;
  float in_stack_fffffffffffffd8c;
  CEditor *in_stack_fffffffffffffd90;
  CEditor *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  uint in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  int iVar10;
  int iVar11;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aVar12;
  undefined4 uVar13;
  CEditor *pToolTip;
  vector4_base<float> local_208;
  vector4_base<float> local_1f8;
  vec3 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe68;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 local_17c;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aStack_178;
  undefined8 local_170;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_168;
  vector3_base<float> local_150;
  undefined8 local_144;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_13c;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_138;
  float local_134;
  float local_130;
  vector4_base<float> local_e8 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar12 = SUB84(in_R8,0);
  uVar13 = (undefined4)((ulong)in_R8 >> 0x20);
  iVar11 = -1;
  iVar10 = 0;
  pToolTip = in_RDI;
  while (*(long *)((long)in_RDX + (long)iVar10 * 0x18) != 0) {
    CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                       (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f45f8);
    CUIRect::VSplitMid((CUIRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                       (CUIRect *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
    CUIRect::HMargin((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                     (CUIRect *)in_stack_fffffffffffffd68);
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (CUIRect *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd8c,(int)in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                 SUB41((uint)in_stack_fffffffffffffd80 >> 0x18,0));
    if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 0xc) == 2) {
      CUIRect::VSplitRight
                ((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                 (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f46b1);
      CUIRect::VSplitLeft((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                          (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f46d1);
      str_format(&stack0xffffffffffffffb8,0x40,"%d",
                 (ulong)*(uint *)((long)in_RDX + (long)iVar10 * 0x18 + 8));
      vector4_base<float>::vector4_base(local_e8,1.0,1.0,1.0,0.5);
      CUIRect::Draw(in_RSI,in_RDX,(float)((ulong)in_RCX >> 0x20),(int)in_RCX);
      UI(in_RDI);
      CUI::DoLabel((CUI *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (CUIRect *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd8c,(int)in_stack_fffffffffffffd88,
                   in_stack_fffffffffffffd84,SUB41((uint)in_stack_fffffffffffffd80 >> 0x18,0));
      iVar3 = DoButton_ButtonDec((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(int *)CONCAT44(uVar13,aVar12) = *(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) + -1;
        iVar11 = iVar10;
      }
      in_stack_fffffffffffffd68 = "Increase";
      iVar3 = DoButton_ButtonInc((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(int *)CONCAT44(uVar13,aVar12) = *(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) + 1;
        iVar11 = iVar10;
      }
    }
    else if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 0xc) == 1) {
      CUIRect::VSplitMid((CUIRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (CUIRect *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
      iVar3 = DoButton_ButtonDec((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(undefined4 *)CONCAT44(uVar13,aVar12) = 0;
        iVar11 = iVar10;
      }
      in_stack_fffffffffffffd68 = "";
      iVar3 = DoButton_ButtonInc((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(undefined4 *)CONCAT44(uVar13,aVar12) = 1;
        iVar11 = iVar10;
      }
    }
    else if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 0xc) == 3) {
      in_stack_fffffffffffffd68 =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                            *(undefined4 *)((long)in_RDX + (long)iVar10 * 0x18 + 0x14));
      in_stack_fffffffffffffd70 = 1;
      in_stack_fffffffffffffd78 =
           "Use left mouse button to drag and change the value. Hold shift to be more precise.";
      in_stack_fffffffffffffdc4 =
           UiDoValueSelector((CEditor *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                             (void *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (CUIRect *)in_RDI,
                             (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                             (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                             (int)in_stack_fffffffffffffd98,(int)in_stack_fffffffffffffe58.field_2,
                             (int)in_stack_fffffffffffffe68,
                             (float)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                             (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if (in_stack_fffffffffffffdc4 != *(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8)) {
        *(int *)CONCAT44(uVar13,aVar12) = in_stack_fffffffffffffdc4;
        iVar11 = iVar10;
      }
    }
    else if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 0xc) == 4) {
      in_stack_fffffffffffffdc0.z = 0.0;
      CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                         (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f4a80);
      CUIRect::VSplitMid((CUIRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (CUIRect *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
      CUIRect::HMargin((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                       (CUIRect *)in_stack_fffffffffffffd68);
      CUIRect::VMargin((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                       (CUIRect *)in_stack_fffffffffffffd68);
      for (in_stack_fffffffffffffdbc = 0; in_stack_fffffffffffffdbc < 4;
          in_stack_fffffffffffffdbc = in_stack_fffffffffffffdbc + 1) {
        uVar4 = *(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) >>
                ((byte)DoProperties::s_aShift[in_stack_fffffffffffffdbc] & 0x1f);
        in_stack_fffffffffffffdb8 = uVar4 & 0xff;
        in_stack_fffffffffffffd68 =
             (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffd68 >> 0x20),0xff);
        in_stack_fffffffffffffd70 = 1;
        in_stack_fffffffffffffd78 =
             "Use left mouse button to drag and change the color value. Hold shift to be more precise."
        ;
        iVar3 = UiDoValueSelector((CEditor *)
                                  (CONCAT44(in_stack_fffffffffffffdbc,uVar4) & 0xffffffff000000ff),
                                  (void *)CONCAT44(in_stack_fffffffffffffdb4,
                                                   in_stack_fffffffffffffdb0),(CUIRect *)in_RDI,
                                  (char *)CONCAT44(in_stack_fffffffffffffda4,
                                                   in_stack_fffffffffffffda0),
                                  (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                  (int)in_stack_fffffffffffffd98,
                                  (int)in_stack_fffffffffffffe58.field_2,
                                  (int)in_stack_fffffffffffffe68,
                                  (float)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                                  (char *)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70));
        in_stack_fffffffffffffdc0.z =
             iVar3 << ((byte)DoProperties::s_aShift[in_stack_fffffffffffffdbc] & 0x1f) |
             in_stack_fffffffffffffdc0.z;
        if (in_stack_fffffffffffffdbc != 3) {
          CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                             (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f4bb7);
          CUIRect::HMargin((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                           (CUIRect *)in_stack_fffffffffffffd68);
        }
      }
      vector4_base<float>::vector4_base
                ((vector4_base<float> *)&local_138,
                 (float)(*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) >>
                         ((byte)DoProperties::s_aShift[0] & 0x1f) & 0xff) / 255.0,
                 (float)(*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) >>
                         ((byte)DoProperties::s_aShift[1] & 0x1f) & 0xff) / 255.0,
                 (float)(*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) >>
                         ((byte)DoProperties::s_aShift[2] & 0x1f) & 0xff) / 255.0,1.0);
      CUIRect::Draw(in_RSI,in_RDX,(float)((ulong)in_RCX >> 0x20),(int)in_RCX);
      pcVar9 = (code *)0x0;
      iVar3 = DoButton_Editor_Common
                        (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (int)in_stack_fffffffffffffd84,(CUIRect *)in_stack_fffffffffffffd78,
                         (int)in_stack_fffffffffffffd74,
                         (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      if (iVar3 != 0) {
        vector3_base<float>::vector3_base(&local_150,local_138.x,local_134,local_130);
        vVar8.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)in_stack_fffffffffffffdbc
        ;
        vVar8.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)in_stack_fffffffffffffdb8
        ;
        vVar8.field_2 = in_stack_fffffffffffffdc0;
        vVar8 = RgbToHsv(vVar8);
        local_170 = vVar8._0_8_;
        local_144 = local_170;
        local_168 = vVar8.field_2;
        local_13c = local_168;
        (in_RDI->m_InitialPickerColor).field_0 =
             (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(undefined4)local_170;
        (in_RDI->m_InitialPickerColor).field_1 =
             (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)local_170._4_4_;
        (in_RDI->m_InitialPickerColor).field_2 = local_168;
        aVar1 = (in_RDI->m_InitialPickerColor).field_1;
        (in_RDI->m_SelectedPickerColor).field_0 = (in_RDI->m_InitialPickerColor).field_0;
        (in_RDI->m_SelectedPickerColor).field_1 = aVar1;
        (in_RDI->m_SelectedPickerColor).field_2 = (in_RDI->m_InitialPickerColor).field_2;
        in_stack_fffffffffffffd98 = (CEditor *)UI(in_RDI);
        pCVar5 = UI(in_RDI);
        fVar7 = CUI::MouseX(pCVar5);
        in_stack_fffffffffffffda4 = (int)fVar7;
        pCVar5 = UI(in_RDI);
        CUI::MouseY(pCVar5);
        pcVar9 = PopupColorPicker;
        in_stack_fffffffffffffd70 = 0xf;
        CUI::DoPopupMenu((CUI *)in_stack_fffffffffffffd90,(int)in_stack_fffffffffffffd8c,
                         (int)in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84,
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         (_func_bool_void_ptr_CUIRect *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),(int)in_RDI);
      }
      bVar2 = vector3_base<float>::operator!=
                        (&in_RDI->m_InitialPickerColor,&in_RDI->m_SelectedPickerColor);
      if (bVar2) {
        (in_RDI->m_InitialPickerColor).field_2 = (in_RDI->m_SelectedPickerColor).field_2;
        aVar1 = (in_RDI->m_SelectedPickerColor).field_1;
        (in_RDI->m_InitialPickerColor).field_0 = (in_RDI->m_SelectedPickerColor).field_0;
        (in_RDI->m_InitialPickerColor).field_1 = aVar1;
        in_stack_fffffffffffffe70 = (in_RDI->m_SelectedPickerColor).field_2;
        in_stack_fffffffffffffe68._0_4_ = (in_RDI->m_SelectedPickerColor).field_0;
        in_stack_fffffffffffffe68._4_4_ = (in_RDI->m_SelectedPickerColor).field_1;
        hsv.field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)iVar11;
        hsv.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)iVar10;
        hsv.field_2 = aVar12;
        in_stack_fffffffffffffe58 = HsvToRgb(hsv);
        local_17c = in_stack_fffffffffffffe58.field_0;
        aStack_178 = in_stack_fffffffffffffe58.field_1;
        in_stack_fffffffffffffdc0 =
             (anon_union_4_4_d826a04f_for_vector3_base<float>_5)
             ((int)(local_17c.x * 255.0) << 0x18 | ((int)(aStack_178.y * 255.0) & 0xffU) << 0x10 |
              ((int)(in_stack_fffffffffffffe58.field_2.z * 255.0) & 0xffU) << 8 |
             *(uint *)((long)in_RDX + (long)iVar10 * 0x18 + 8) & 0xff);
      }
      in_stack_fffffffffffffd68 = (char *)pcVar9;
      if (in_stack_fffffffffffffdc0 !=
          *(anon_union_4_4_d826a04f_for_vector3_base<float>_5 *)
           ((long)in_RDX + (long)iVar10 * 0x18 + 8)) {
        *(anon_union_4_4_d826a04f_for_vector3_base<float>_5 *)CONCAT44(uVar13,aVar12) =
             in_stack_fffffffffffffdc0;
        iVar11 = iVar10;
      }
    }
    else if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 0xc) == 5) {
      if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8) < 0) {
        str_copy((char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 in_stack_fffffffffffffd68,0);
      }
      else {
        in_stack_fffffffffffffd90 = (CEditor *)&stack0xffffffffffffff78;
        ppCVar6 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                            (&(in_RDI->m_Map).m_lImages,
                             *(int *)((long)in_RDX + (long)iVar10 * 0x18 + 8));
        str_format((char *)in_stack_fffffffffffffd90,0x40,"%s",(*ppCVar6)->m_aName);
      }
      in_stack_fffffffffffffd68 = (char *)0x0;
      iVar3 = DoButton_Editor(in_RDI,(void *)CONCAT44(in_stack_fffffffffffffda4,
                                                      in_stack_fffffffffffffda0),
                              (char *)in_stack_fffffffffffffd98,
                              (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                              (CUIRect *)
                              CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                              (int)in_stack_fffffffffffffd84,(char *)CONCAT44(uVar13,aVar12));
      if (iVar3 != 0) {
        in_stack_fffffffffffffd88 = *(float *)((long)in_RDX + (long)iVar10 * 0x18 + 8);
        pCVar5 = UI(in_RDI);
        in_stack_fffffffffffffd8c = CUI::MouseX(pCVar5);
        pCVar5 = UI(in_RDI);
        CUI::MouseY(pCVar5);
        PopupSelectImageInvoke
                  (in_stack_fffffffffffffd90,(int)in_stack_fffffffffffffd8c,
                   in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
      }
      in_stack_fffffffffffffdb4 = PopupSelectImageResult(in_RDI);
      if (-2 < in_stack_fffffffffffffdb4) {
        *(int *)CONCAT44(uVar13,aVar12) = in_stack_fffffffffffffdb4;
        iVar11 = iVar10;
      }
    }
    else if (*(int *)((long)in_RDX + (long)iVar10 * 0x18 + 0xc) == 7) {
      CUIRect::VSplitMid((CUIRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (CUIRect *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
      CUIRect::VSplitLeft((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                          (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f5143);
      CUIRect::VSplitRight
                ((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                 (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f5163);
      vector4_base<float>::vector4_base(&local_1f8,1.0,1.0,1.0,0.5);
      CUIRect::Draw(in_RSI,in_RDX,(float)((ulong)in_RCX >> 0x20),(int)in_RCX);
      UI(in_RDI);
      CUI::DoLabel((CUI *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (CUIRect *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd8c,(int)in_stack_fffffffffffffd88,
                   in_stack_fffffffffffffd84,SUB41((uint)in_stack_fffffffffffffd80 >> 0x18,0));
      CUIRect::VSplitLeft((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                          (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f51fa);
      CUIRect::VSplitRight
                ((CUIRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                 (CUIRect *)in_stack_fffffffffffffd68,(CUIRect *)0x1f521a);
      vector4_base<float>::vector4_base(&local_208,1.0,1.0,1.0,0.5);
      CUIRect::Draw(in_RSI,in_RDX,(float)((ulong)in_RCX >> 0x20),(int)in_RCX);
      UI(in_RDI);
      CUI::DoLabel((CUI *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (CUIRect *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd8c,(int)in_stack_fffffffffffffd88,
                   in_stack_fffffffffffffd84,SUB41((uint)in_stack_fffffffffffffd80 >> 0x18,0));
      iVar3 = DoButton_ButtonDec((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(undefined4 *)CONCAT44(uVar13,aVar12) = 1;
        iVar11 = iVar10;
      }
      iVar3 = DoButton_ButtonInc((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(undefined4 *)CONCAT44(uVar13,aVar12) = 2;
        iVar11 = iVar10;
      }
      iVar3 = DoButton_ButtonDec((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(undefined4 *)CONCAT44(uVar13,aVar12) = 4;
        iVar11 = iVar10;
      }
      in_stack_fffffffffffffd68 = "Down";
      iVar3 = DoButton_ButtonInc((CEditor *)CONCAT44(iVar11,iVar10),
                                 (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8),
                                 in_stack_fffffffffffffdb4,(CUIRect *)in_RDI,
                                 in_stack_fffffffffffffda4,(char *)pToolTip);
      if (iVar3 != 0) {
        *(undefined4 *)CONCAT44(uVar13,aVar12) = 8;
        iVar11 = iVar10;
      }
    }
    iVar10 = iVar10 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

int CEditor::DoProperties(CUIRect *pToolBox, CProperty *pProps, int *pIDs, int *pNewVal)
{
	int Change = -1;

	for(int i = 0; pProps[i].m_pName; i++)
	{
		CUIRect Slot;
		pToolBox->HSplitTop(13.0f, &Slot, pToolBox);
		CUIRect Label, Shifter;
		Slot.VSplitMid(&Label, &Shifter);
		Shifter.HMargin(1.0f, &Shifter);
		UI()->DoLabel(&Label, pProps[i].m_pName, 10.0f, TEXTALIGN_LEFT);

		if(pProps[i].m_Type == PROPTYPE_INT_STEP)
		{
			CUIRect Inc, Dec;
			char aBuf[64];

			Shifter.VSplitRight(10.0f, &Shifter, &Inc);
			Shifter.VSplitLeft(10.0f, &Dec, &Shifter);
			str_format(aBuf, sizeof(aBuf),"%d", pProps[i].m_Value);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, aBuf, 10.0f,TEXTALIGN_CENTER);

			if(DoButton_ButtonDec(&pIDs[i], 0, 0, &Dec, 0, "Decrease"))
			{
				*pNewVal = pProps[i].m_Value-1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, 0, 0, &Inc, 0, "Increase"))
			{
				*pNewVal = pProps[i].m_Value+1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_BOOL)
		{
			CUIRect No, Yes;
			Shifter.VSplitMid(&No, &Yes);
			if(DoButton_ButtonDec(&pIDs[i], "No", !pProps[i].m_Value, &No, 0, ""))
			{
				*pNewVal = 0;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, "Yes", pProps[i].m_Value, &Yes, 0, ""))
			{
				*pNewVal = 1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_INT_SCROLL)
		{
			int NewValue = UiDoValueSelector(&pIDs[i], &Shifter, "", pProps[i].m_Value, pProps[i].m_Min, pProps[i].m_Max, 1, 1.0f, "Use left mouse button to drag and change the value. Hold shift to be more precise.");
			if(NewValue != pProps[i].m_Value)
			{
				*pNewVal = NewValue;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_COLOR)
		{
			static const char *s_paTexts[4] = {"R", "G", "B", "A"};
			static int s_aShift[] = {24, 16, 8, 0};
			int NewColor = 0;

			// extra space
			CUIRect ColorBox, ColorSlots;

			pToolBox->HSplitTop(3.0f*13.0f, &Slot, pToolBox);
			Slot.VSplitMid(&ColorBox, &ColorSlots);
			ColorBox.HMargin(1.0f, &ColorBox);
			ColorBox.VMargin(6.0f, &ColorBox);

			for(int c = 0; c < 4; c++)
			{
				int v = (pProps[i].m_Value >> s_aShift[c])&0xff;
				NewColor |= UiDoValueSelector(((char *)&pIDs[i])+c, &Shifter, s_paTexts[c], v, 0, 255, 1, 1.0f, "Use left mouse button to drag and change the color value. Hold shift to be more precise.")<<s_aShift[c];

				if(c != 3)
				{
					ColorSlots.HSplitTop(13.0f, &Shifter, &ColorSlots);
					Shifter.HMargin(1.0f, &Shifter);
				}
			}

			// color picker
			vec4 Color = vec4(
				((pProps[i].m_Value >> s_aShift[0])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[1])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[2])&0xff)/255.0f,
				1.0f);

			ColorBox.Draw(Color, 0.0f, CUIRect::CORNER_NONE);
			static int s_ColorPicker;
			if(DoButton_Editor_Common(&s_ColorPicker, 0x0, 0, &ColorBox, 0, 0x0))
			{
				m_InitialPickerColor = RgbToHsv(vec3(Color.r, Color.g, Color.b));
				m_SelectedPickerColor = m_InitialPickerColor;
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 180, 180, this, PopupColorPicker);
			}

			if(m_InitialPickerColor != m_SelectedPickerColor)
			{
				m_InitialPickerColor = m_SelectedPickerColor;
				vec3 c = HsvToRgb(m_SelectedPickerColor);
				NewColor = ((int)(c.r * 255.0f)&0xff) << 24 | ((int)(c.g * 255.0f)&0xff) << 16 | ((int)(c.b * 255.0f)&0xff) << 8 | (pProps[i].m_Value&0xff);
			}

			if(NewColor != pProps[i].m_Value)
			{
				*pNewVal = NewColor;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_IMAGE)
		{
			char aBuf[64];
			if(pProps[i].m_Value < 0)
				str_copy(aBuf, "None", sizeof(aBuf));
			else
				str_format(aBuf, sizeof(aBuf),"%s", m_Map.m_lImages[pProps[i].m_Value]->m_aName);

			if(DoButton_Editor(&pIDs[i], aBuf, 0, &Shifter, 0, 0))
				PopupSelectImageInvoke(pProps[i].m_Value, UI()->MouseX(), UI()->MouseY());

			int r = PopupSelectImageResult();
			if(r >= -1)
			{
				*pNewVal = r;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_SHIFT)
		{
			CUIRect Left, Right, Up, Down;
			Shifter.VSplitMid(&Left, &Up, 2.0f);
			Left.VSplitLeft(10.0f, &Left, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Right);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "X", 10.0f, TEXTALIGN_CENTER);
			Up.VSplitLeft(10.0f, &Up, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Down);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "Y", 10.0f, TEXTALIGN_CENTER);
			if(DoButton_ButtonDec(&pIDs[i], "-", 0, &Left, 0, "Left"))
			{
				*pNewVal = 1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+3, "+", 0, &Right, 0, "Right"))
			{
				*pNewVal = 2;
				Change = i;
			}
			if(DoButton_ButtonDec(((char *)&pIDs[i])+1, "-", 0, &Up, 0, "Up"))
			{
				*pNewVal = 4;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+2, "+", 0, &Down, 0, "Down"))
			{
				*pNewVal = 8;
				Change = i;
			}
		}
	}

	return Change;
}